

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_int xmrig::OclLib::release(cl_program program)

{
  char *fmt;
  char *pcVar1;
  cl_program in_RDI;
  cl_int ret;
  cl_int local_4;
  
  if (in_RDI == (cl_program)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pReleaseProgram)(in_RDI);
    fmt = kErrorTemplate;
    if (local_4 != 0) {
      pcVar1 = OclError::toString(local_4);
      Log::print(ERR,fmt,pcVar1,kReleaseProgram);
    }
  }
  return local_4;
}

Assistant:

cl_int xmrig::OclLib::release(cl_program program) noexcept
{
    assert(pReleaseProgram != nullptr);

    if (program == nullptr) {
        return CL_SUCCESS;
    }

    LOG_REFS("%p %u ~program %s", program, getUint(program, CL_PROGRAM_REFERENCE_COUNT), getString(program, CL_PROGRAM_KERNEL_NAMES).data());

    const cl_int ret = pReleaseProgram(program);
    if (ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(ret), kReleaseProgram);
    }

    return ret;
}